

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_test.cc
# Opt level: O3

void __thiscall
fizplex::LPTest_AddColumnIncreasesColumnCount_Test::TestBody
          (LPTest_AddColumnIncreasesColumnCount_Test *this)

{
  bool bVar1;
  size_t sVar2;
  char *in_R9;
  AssertionResult gtest_ar_;
  LP lp;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  AssertHelper local_c8;
  internal local_c0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  string local_b0;
  LP local_90;
  
  LP::LP(&local_90);
  LP::add_column(&local_90,Bounded,-1.33333,302.0,0.0);
  sVar2 = LP::column_count(&local_90);
  local_c0[0] = (internal)(sVar2 == 1);
  local_b8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_c0[0]) {
    testing::Message::Message((Message *)&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,local_c0,(AssertionResult *)"lp.column_count() == 1","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x35,local_b0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (local_d0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_d0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_d0.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_90.rows.super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.rows.
                    super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.rows.
                          super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.rows.
                          super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_90.cols.super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.cols.
                    super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.cols.
                          super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.cols.
                          super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  operator_delete(local_90.c.vals._M_data);
  operator_delete(local_90.b.vals._M_data);
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector
            ((vector<fizplex::SVector,_std::allocator<fizplex::SVector>_> *)&local_90);
  return;
}

Assistant:

TEST(LPTest, AddColumnIncreasesColumnCount) {
  LP lp;
  lp.add_column(ColType::Bounded, -1.33333, 302);
  EXPECT_TRUE(lp.column_count() == 1);
}